

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O2

avl_node_t * avl_rotate_RR(avl_node_t *parent)

{
  avl_node_t *node;
  
  node = parent->right;
  parent->right = node->left;
  node->left = parent;
  avl_update_height(parent);
  avl_update_height(node);
  return node;
}

Assistant:

static avl_node_t*
avl_rotate_RR(avl_node_t *parent)
{
    avl_node_t *child = parent->right;
    parent->right = child->left;
    child->left = parent;
    avl_update_height(parent);
    avl_update_height(child);
    return child;
}